

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>::initPrograms
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>
           *this,SourceCollections *programCollection)

{
  _Rb_tree_color _Var1;
  ProgramSources *pPVar2;
  _Base_ptr p_Var3;
  char *in_RCX;
  allocator<char> local_a9;
  string local_a8;
  _Rb_tree_node_base *local_88;
  SourceCollections *local_80;
  _Rb_tree_color local_78;
  value_type local_70;
  string local_50;
  
  p_Var3 = (this->m_shaderPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = &(this->m_shaderPaths)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != local_88) {
    local_80 = programCollection;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)p_Var3[1]._M_parent,&local_a9);
      pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_80->glslSources,&local_50);
      _Var1 = p_Var3[1]._M_color;
      ShaderSourceProvider::getSource_abi_cxx11_
                (&local_a8,
                 (ShaderSourceProvider *)
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
                 (Archive *)p_Var3[1]._M_parent,in_RCX);
      local_78 = _Var1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pPVar2->sources + local_78,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_88);
  }
  return;
}

Assistant:

virtual void initPrograms (vk::SourceCollections& programCollection) const
	{
		for (ShaderMap::const_iterator i = m_shaderPaths.begin(); i != m_shaderPaths.end(); ++i)
		{
			programCollection.glslSources.add(i->second) <<
				glu::ShaderSource(i->first, ShaderSourceProvider::getSource(m_testCtx.getArchive(), i->second));
		}
	}